

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

void ZSTD_updateStats(optState_t *optPtr,U32 litLength,BYTE *literals,U32 offsetCode,U32 matchLength
                     )

{
  uint uVar1;
  uint uVar2;
  U32 u;
  ulong uVar3;
  
  if (optPtr->literalCompressionMode != ZSTD_lcm_uncompressed) {
    for (uVar3 = 0; litLength != uVar3; uVar3 = uVar3 + 1) {
      optPtr->litFreq[literals[uVar3]] = optPtr->litFreq[literals[uVar3]] + 2;
    }
    optPtr->litSum = optPtr->litSum + litLength * 2;
  }
  if (litLength < 0x40) {
    uVar2 = (uint)(byte)ZSTD_LLcode_LL_Code[litLength];
  }
  else {
    uVar2 = 0x1f;
    if (litLength != 0) {
      for (; litLength >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = (uVar2 ^ 0xffffffe0) + 0x33;
  }
  optPtr->litLengthFreq[uVar2] = optPtr->litLengthFreq[uVar2] + 1;
  optPtr->litLengthSum = optPtr->litLengthSum + 1;
  uVar2 = 0x1f;
  if (offsetCode + 1 != 0) {
    for (; offsetCode + 1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  optPtr->offCodeFreq[uVar2] = optPtr->offCodeFreq[uVar2] + 1;
  optPtr->offCodeSum = optPtr->offCodeSum + 1;
  uVar2 = matchLength - 3;
  if (uVar2 < 0x80) {
    uVar2 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar2];
  }
  else {
    uVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar2 = (uVar1 ^ 0xffffffe0) + 0x44;
  }
  optPtr->matchLengthFreq[uVar2] = optPtr->matchLengthFreq[uVar2] + 1;
  optPtr->matchLengthSum = optPtr->matchLengthSum + 1;
  return;
}

Assistant:

static void ZSTD_updateStats(optState_t* const optPtr,
                             U32 litLength, const BYTE* literals,
                             U32 offsetCode, U32 matchLength)
{
    /* literals */
    if (ZSTD_compressedLiterals(optPtr)) {
        U32 u;
        for (u=0; u < litLength; u++)
            optPtr->litFreq[literals[u]] += ZSTD_LITFREQ_ADD;
        optPtr->litSum += litLength*ZSTD_LITFREQ_ADD;
    }

    /* literal Length */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        optPtr->litLengthFreq[llCode]++;
        optPtr->litLengthSum++;
    }

    /* match offset code (0-2=>repCode; 3+=>offset+2) */
    {   U32 const offCode = ZSTD_highbit32(offsetCode+1);
        assert(offCode <= MaxOff);
        optPtr->offCodeFreq[offCode]++;
        optPtr->offCodeSum++;
    }

    /* match Length */
    {   U32 const mlBase = matchLength - MINMATCH;
        U32 const mlCode = ZSTD_MLcode(mlBase);
        optPtr->matchLengthFreq[mlCode]++;
        optPtr->matchLengthSum++;
    }
}